

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ll_ifc.c
# Opt level: O1

int32_t ll_trigger_watchdog(void)

{
  _Bool _Var1;
  int32_t iVar2;
  
  _Var1 = transport_mutex_grab();
  if (_Var1) {
    _ll_ifc_msg_buff[0] = '\0';
    _ll_ifc_msg_buff[1] = '\x01';
    iVar2 = hal_read_write(OP_RESERVED1,_ll_ifc_msg_buff,2,(uint8_t *)0x0,0);
    transport_mutex_release();
    return iVar2;
  }
  return -0x71;
}

Assistant:

int32_t ll_trigger_watchdog(void)
{
    uint8_t cmd_buf[2];

    if (!(transport_mutex_grab()))
    {
        return LL_IFC_ERROR_HAL_CALL_FAILED;
    }

    _ll_ifc_msg_buff[0] = 0x00;
    _ll_ifc_msg_buff[1] = 0x01;

    int32_t ret = hal_read_write(OP_RESERVED1, &_ll_ifc_msg_buff[0], 2, NULL, 0);

    transport_mutex_release();

    return ret;
}